

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O2

void __thiscall
JointPolicyPureVector::JointPolicyPureVector
          (JointPolicyPureVector *this,Interface_ProblemToPolicyDiscretePure *pu)

{
  undefined4 uVar1;
  
  uVar1 = (**(code **)(*(long *)pu + 0x40))(pu);
  JointPolicyDiscretePure::JointPolicyDiscretePure((JointPolicyDiscretePure *)this,pu,uVar1);
  uVar1 = (**(code **)(*(long *)pu + 0x40))(pu);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(this + 0x38),pu,uVar1,999999);
  *(code **)this = std::ios_base::Init::Init;
  *(undefined8 *)(this + 0x38) = 0x108238;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  return;
}

Assistant:

JointPolicyPureVector(const Interface_ProblemToPolicyDiscretePure* pu)
          :
          JointPolicyDiscretePure( pu , pu->GetDefaultIndexDomCat()  ),
          JPolComponent_VectorImplementation(pu,  pu->GetDefaultIndexDomCat() )
        {}